

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableSymbols.cpp
# Opt level: O0

void __thiscall slang::ast::NetSymbol::checkInitializer(NetSymbol *this)

{
  bool bVar1;
  Expression *pEVar2;
  Scope *this_00;
  Symbol *pSVar3;
  Symbol *in_RDI;
  Scope *parent;
  Expression *init;
  Scope *in_stack_00000108;
  undefined1 in_stack_00000110 [16];
  DiagCode in_stack_00000124;
  Expression *in_stack_ffffffffffffffd0;
  
  pEVar2 = ValueSymbol::getInitializer((ValueSymbol *)0x9d83a7);
  this_00 = Symbol::getParentScope(in_RDI);
  if ((pEVar2 != (Expression *)0x0) && (this_00 != (Scope *)0x0)) {
    pSVar3 = Scope::asSymbol(this_00);
    if (pSVar3->kind == Package) {
      bVar1 = Expression::bad(in_stack_ffffffffffffffd0);
      if (!bVar1) {
        Scope::addDiag(in_stack_00000108,in_stack_00000124,(SourceRange)in_stack_00000110);
      }
    }
  }
  return;
}

Assistant:

void NetSymbol::checkInitializer() const {
    // Disallow initializers inside packages. Enforcing this check requires knowing
    // about user-defined nettypes, which is why we can't just do it in the parser.
    auto init = getInitializer();
    auto parent = getParentScope();
    if (init && parent && parent->asSymbol().kind == SymbolKind::Package && !init->bad())
        parent->addDiag(diag::PackageNetInit, init->sourceRange);
}